

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkTorsions(MoleculeStamp *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  _Base_ptr p_Var1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  ostream *poVar7;
  undefined8 uVar8;
  reference piVar9;
  reference pvVar10;
  size_type sVar11;
  _Base_ptr p_Var12;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>,_bool> pVar13;
  TorsionStamp *newTorsionStamp;
  type_conflict1 *fourth_1;
  type_conflict1 *third_1;
  type_conflict1 *second_1;
  type_conflict1 *first_1;
  tuple<int,_int,_int,_int> newTorsion;
  int d;
  int a;
  AtomIter ai3;
  AtomIter ai2;
  AtomStamp *atomC;
  AtomStamp *atomB;
  int c;
  int b;
  BondStamp *bondStamp;
  size_t i_3;
  type_conflict1 *fourth;
  type_conflict1 *third;
  type_conflict1 *second;
  type_conflict1 *first;
  tuple<int,_int,_int,_int> torsionTuple;
  iterator j_2;
  int ghostIndex;
  vector<int,_std::allocator<int>_> torsion;
  TorsionStamp *torsionStamp_2;
  size_t i_2;
  iterator iter;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  int rigidbodyIndex;
  iterator j_1;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> torsionAtoms_1;
  TorsionStamp *torsionStamp_1;
  size_t i_1;
  iterator k;
  iterator j;
  vector<int,_std::allocator<int>_> torsionAtoms;
  TorsionStamp *torsionStamp;
  size_t i;
  ostringstream oss;
  undefined4 in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  int in_stack_fffffffffffff830;
  int in_stack_fffffffffffff834;
  string *in_stack_fffffffffffff838;
  undefined7 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff847;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff848;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff860;
  TorsionStamp *this_00;
  undefined4 in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff86c;
  value_type_conflict1 *in_stack_fffffffffffff8b8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8c0;
  const_iterator in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  TorsionStamp *in_stack_fffffffffffff920;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9d8;
  bool local_611;
  _Self local_5b0;
  _Self local_5a8;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_5a0;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int>_> *local_598;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int>_> *local_590;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int>_> *local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  int local_560;
  int local_55c;
  _Rb_tree_const_iterator<int> local_558;
  undefined1 local_550 [16];
  AtomStamp *local_540;
  int local_538;
  int local_534;
  BondStamp *local_530;
  _Base_ptr local_528;
  undefined1 local_519;
  string local_4f8 [32];
  string local_4d8 [32];
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  _Self local_4a8;
  _Base_ptr local_4a0;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_498;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int>_> *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_488;
  double *local_478;
  double local_470 [2];
  int *local_460;
  int *local_450;
  int *local_448;
  int *local_440;
  int *local_438;
  int local_42c;
  vector<int,_std::allocator<int>_> local_428;
  TorsionStamp *local_410;
  ulong local_408;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_> local_400 [7];
  undefined1 local_3c1;
  string local_3a0 [32];
  string local_380 [36];
  int local_35c;
  int *local_358;
  int *local_350;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_348;
  undefined4 local_33c;
  vector<int,_std::allocator<int>_> local_338 [2];
  TorsionStamp *local_308;
  ulong local_300;
  undefined1 local_2f1;
  string local_2d0 [32];
  string local_2b0 [39];
  undefined1 local_289;
  string local_268 [32];
  string local_248 [32];
  int *local_228;
  int *local_220;
  undefined4 local_218;
  int *local_208;
  int *local_200;
  int *local_1f8;
  long local_1f0;
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  TorsionStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  while( true ) {
    uVar2 = local_188;
    sVar5 = getNTorsions((MoleculeStamp *)0x2c7125);
    if (sVar5 <= uVar2) {
      local_300 = 0;
      do {
        uVar2 = local_300;
        sVar5 = getNTorsions((MoleculeStamp *)0x2c77da);
        if (sVar5 <= uVar2) {
          std::
          set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
          ::set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 *)0x2c7c46);
          std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>::_Rb_tree_const_iterator
                    (local_400);
          local_408 = 0;
          while( true ) {
            uVar2 = local_408;
            sVar5 = getNTorsions((MoleculeStamp *)0x2c7c7c);
            if (sVar5 <= uVar2) {
              for (local_528 = (_Base_ptr)0x0; p_Var1 = local_528,
                  p_Var12 = (_Base_ptr)getNBonds((MoleculeStamp *)0x2c8270), p_Var1 < p_Var12;
                  local_528 = (_Base_ptr)((long)&local_528->_M_color + 1)) {
                local_530 = getBondStamp((MoleculeStamp *)
                                         CONCAT44(in_stack_fffffffffffff834,
                                                  in_stack_fffffffffffff830),
                                         in_stack_fffffffffffff82c);
                local_534 = BondStamp::getA(local_530);
                local_538 = BondStamp::getB(local_530);
                local_540 = getAtomStamp((MoleculeStamp *)
                                         CONCAT44(in_stack_fffffffffffff834,
                                                  in_stack_fffffffffffff830),
                                         in_stack_fffffffffffff82c);
                local_550._8_8_ =
                     getAtomStamp((MoleculeStamp *)
                                  CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                  in_stack_fffffffffffff82c);
                this_00 = (TorsionStamp *)local_550;
                std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
                          ((_Rb_tree_const_iterator<int> *)this_00);
                std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_558);
                local_55c = AtomStamp::getFirstBondedAtom
                                      ((AtomStamp *)in_stack_fffffffffffff850._M_current,
                                       (AtomIter *)in_stack_fffffffffffff848._M_current);
                while (local_55c != -1) {
                  if (local_55c != local_538) {
                    iVar4 = AtomStamp::getFirstBondedAtom
                                      ((AtomStamp *)in_stack_fffffffffffff850._M_current,
                                       (AtomIter *)in_stack_fffffffffffff848._M_current);
                    local_560 = iVar4;
                    while (local_560 != -1) {
                      if (local_560 != local_534) {
                        std::tuple<int,_int,_int,_int>::
                        tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                                  ((tuple<int,_int,_int,_int> *)
                                   CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                                   (int *)in_stack_fffffffffffff838,
                                   (int *)CONCAT44(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830),
                                   (int *)CONCAT44(in_stack_fffffffffffff82c,
                                                   in_stack_fffffffffffff828),(int *)0x2c8419);
                        local_580 = local_570;
                        local_578 = local_568;
                        local_588 = std::get<0ul,int,int,int,int>
                                              ((tuple<int,_int,_int,_int> *)0x2c8446);
                        local_590 = std::get<1ul,int,int,int,int>
                                              ((tuple<int,_int,_int,_int> *)0x2c845b);
                        local_598 = std::get<2ul,int,int,int,int>
                                              ((tuple<int,_int,_int,_int> *)0x2c8470);
                        local_5a0 = std::get<3ul,int,int,int,int>
                                              ((tuple<int,_int,_int,_int> *)0x2c8485);
                        if (*local_5a0 < *local_588) {
                          std::swap<int>(local_588,local_5a0);
                          std::swap<int>(local_590,local_598);
                        }
                        in_stack_fffffffffffff850._M_current =
                             (int *)std::
                                    set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                    ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                            *)in_stack_fffffffffffff838,
                                           (key_type *)
                                           CONCAT44(in_stack_fffffffffffff834,
                                                    in_stack_fffffffffffff830));
                        local_5a8._M_node = (_Base_ptr)in_stack_fffffffffffff850._M_current;
                        local_5b0._M_node =
                             (_Base_ptr)
                             std::
                             set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                             ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828))
                        ;
                        bVar3 = std::operator==(&local_5a8,&local_5b0);
                        if (bVar3) {
                          pVar13 = std::
                                   set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                   ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                             *)in_stack_fffffffffffff850._M_current,
                                            (value_type *)in_stack_fffffffffffff848._M_current);
                          in_stack_fffffffffffff848._M_current = (int *)pVar13.first._M_node;
                          in_stack_fffffffffffff847 = pVar13.second;
                          in_stack_fffffffffffff838 = (string *)operator_new(0xf0);
                          TorsionStamp::TorsionStamp(in_stack_fffffffffffff920);
                          TorsionStamp::setMembers
                                    (this_00,(tuple<int,_int,_int,_int> *)
                                             CONCAT44(iVar4,in_stack_fffffffffffff858));
                          addTorsionStamp((MoleculeStamp *)
                                          CONCAT44(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830),
                                          (TorsionStamp *)
                                          CONCAT44(in_stack_fffffffffffff82c,
                                                   in_stack_fffffffffffff828));
                        }
                      }
                      in_stack_fffffffffffff834 =
                           AtomStamp::getNextBondedAtom
                                     ((AtomStamp *)in_stack_fffffffffffff850._M_current,
                                      (AtomIter *)in_stack_fffffffffffff848._M_current);
                      local_560 = in_stack_fffffffffffff834;
                    }
                  }
                  in_stack_fffffffffffff830 =
                       AtomStamp::getNextBondedAtom
                                 ((AtomStamp *)in_stack_fffffffffffff850._M_current,
                                  (AtomIter *)in_stack_fffffffffffff848._M_current);
                  local_55c = in_stack_fffffffffffff830;
                }
              }
              std::
              set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::~set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                      *)0x2c8665);
              std::__cxx11::ostringstream::~ostringstream(local_180);
              return;
            }
            in_stack_fffffffffffff920 =
                 getTorsionStamp((MoleculeStamp *)
                                 CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                 in_stack_fffffffffffff82c);
            local_410 = in_stack_fffffffffffff920;
            TorsionStamp::getMembers
                      ((TorsionStamp *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828)
                      );
            sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_428);
            if (sVar11 == 3) {
              local_42c = TorsionStamp::getGhostVectorSource((TorsionStamp *)0x2c7d08);
              local_440 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff82c,
                                                     in_stack_fffffffffffff828));
              local_448 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff82c,
                                                     in_stack_fffffffffffff828));
              __last._M_current._7_1_ = in_stack_fffffffffffff847;
              __last._M_current._0_7_ = in_stack_fffffffffffff840;
              local_438 = (int *)std::
                                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                           (in_stack_fffffffffffff848,__last,
                                            (int *)in_stack_fffffffffffff838);
              local_450 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff82c,
                                                     in_stack_fffffffffffff828));
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
              if (bVar3) {
                __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                __normal_iterator<int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
                local_460 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                             (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,
                                              in_stack_fffffffffffff8b8);
              }
            }
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,1);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,2);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,3);
            std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int,_int> *)
                       CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                       (int *)in_stack_fffffffffffff838,
                       (int *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (int *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                       (int *)0x2c7ec4);
            local_478 = local_470;
            local_488._8_8_ = std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2c7ee1);
            local_488._M_allocated_capacity =
                 (size_type)std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2c7ef6);
            local_490 = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2c7f0b);
            local_498 = std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2c7f20);
            if (*local_498 < *(int *)local_488._8_8_) {
              std::swap<int>((int *)local_488._8_8_,local_498);
              std::swap<int>((int *)local_488._M_allocated_capacity,local_490);
            }
            local_4a0 = (_Base_ptr)
                        std::
                        set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                *)in_stack_fffffffffffff838,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
            local_400[0]._M_node = local_4a0;
            local_4a8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
            bVar3 = std::operator==(local_400,&local_4a8);
            if (!bVar3) break;
            pVar13 = std::
                     set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                               *)in_stack_fffffffffffff850._M_current,
                              (value_type *)in_stack_fffffffffffff848._M_current);
            local_4b8 = (_Base_ptr)pVar13.first._M_node;
            local_4b0 = pVar13.second;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840));
            local_408 = local_408 + 1;
          }
          poVar7 = std::operator<<((ostream *)local_180,"Error in Molecule ");
          getName_abi_cxx11_((MoleculeStamp *)
                             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
          poVar7 = std::operator<<(poVar7,local_4d8);
          poVar7 = std::operator<<(poVar7,": ");
          poVar7 = std::operator<<(poVar7,"Torsion");
          containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9d8);
          poVar7 = std::operator<<(poVar7,local_4f8);
          std::operator<<(poVar7," appears multiple times\n");
          std::__cxx11::string::~string(local_4f8);
          std::__cxx11::string::~string(local_4d8);
          local_519 = 1;
          uVar8 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException
                    ((OpenMDException *)
                     CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                     in_stack_fffffffffffff838);
          local_519 = 0;
          __cxa_throw(uVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_308 = getTorsionStamp((MoleculeStamp *)
                                    CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                    in_stack_fffffffffffff82c);
        TorsionStamp::getMembers
                  ((TorsionStamp *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
        getNRigidBodies((MoleculeStamp *)0x2c784f);
        local_33c = 0;
        std::allocator<int>::allocator((allocator<int> *)0x2c7879);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff850._M_current,
                   (size_type)in_stack_fffffffffffff848._M_current,
                   (value_type_conflict1 *)
                   CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                   (allocator_type *)in_stack_fffffffffffff838);
        std::allocator<int>::~allocator((allocator<int> *)0x2c78ad);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
        __normal_iterator(&local_348);
        local_350 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828))
        ;
        local_348._M_current = local_350;
        while( true ) {
          local_358 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828
                                                ));
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
          if (!bVar3) break;
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_348);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d8),(long)*piVar9);
          local_35c = *pvVar10;
          if (-1 < local_35c) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](local_338,(long)local_35c);
            *pvVar10 = *pvVar10 + 1;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](local_338,(long)local_35c);
            if (3 < *pvVar10) {
              poVar7 = std::operator<<((ostream *)local_180,"Error in Molecule ");
              getName_abi_cxx11_((MoleculeStamp *)
                                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
              poVar7 = std::operator<<(poVar7,local_380);
              poVar7 = std::operator<<(poVar7,": torsion");
              containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9d8);
              poVar7 = std::operator<<(poVar7,local_3a0);
              std::operator<<(poVar7,"has four atoms on the same rigid body\n");
              std::__cxx11::string::~string(local_3a0);
              std::__cxx11::string::~string(local_380);
              local_3c1 = 1;
              uVar8 = __cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              OpenMDException::OpenMDException
                        ((OpenMDException *)
                         CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                         in_stack_fffffffffffff838);
              local_3c1 = 0;
              __cxa_throw(uVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_348);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840));
        local_300 = local_300 + 1;
      } while( true );
    }
    local_1a0 = getTorsionStamp((MoleculeStamp *)
                                CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                in_stack_fffffffffffff82c);
    TorsionStamp::getMembers
              ((TorsionStamp *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    sVar5 = getNAtoms((MoleculeStamp *)0x2c71cc);
    local_1f0 = sVar5 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)in_stack_fffffffffffff838,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    __first_00._M_current._4_4_ = in_stack_fffffffffffff86c;
    __first_00._M_current._0_4_ = in_stack_fffffffffffff868;
    local_1c0 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                 (__first_00,in_stack_fffffffffffff860,
                                  (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *)
                                  CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    local_200 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_208 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_218 = 0;
    std::bind<std::less<int>,std::_Placeholder<1>const&,int>
              ((less<int> *)in_stack_fffffffffffff838,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (int *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    __first._M_current._4_4_ = in_stack_fffffffffffff85c;
    __first._M_current._0_4_ = in_stack_fffffffffffff858;
    local_1f8 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                                 (__first,in_stack_fffffffffffff850,
                                  in_stack_fffffffffffff848._M_current);
    local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_611 = true;
    if (!bVar3) {
      local_228 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      local_611 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    }
    if (local_611 != false) break;
    bVar3 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    if (bVar3) {
      poVar7 = std::operator<<((ostream *)local_180,"Error in Molecule ");
      getName_abi_cxx11_((MoleculeStamp *)
                         CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      poVar7 = std::operator<<(poVar7,local_2b0);
      poVar7 = std::operator<<(poVar7," : atoms of torsion");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9d8);
      poVar7 = std::operator<<(poVar7,local_2d0);
      std::operator<<(poVar7," have duplicated indices\n");
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2b0);
      local_2f1 = 1;
      uVar8 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838);
      local_2f1 = 0;
      __cxa_throw(uVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840));
    local_188 = local_188 + 1;
  }
  poVar7 = std::operator<<((ostream *)local_180,"Error in Molecule ");
  getName_abi_cxx11_((MoleculeStamp *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828))
  ;
  poVar7 = std::operator<<(poVar7,local_248);
  poVar6 = std::operator<<(poVar7,": atoms of torsion");
  containerToString<std::vector<int,std::allocator<int>>>
            ((vector<int,_std::allocator<int>_> *)poVar7);
  poVar7 = std::operator<<(poVar6,local_268);
  std::operator<<(poVar7," have invalid indices\n");
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  local_289 = 1;
  uVar8 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException
            ((OpenMDException *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
             in_stack_fffffffffffff838);
  local_289 = 0;
  __cxa_throw(uVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple {torsion[0], torsion[1],
                                                   torsion[2], torsion[3]};
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int b                = bondStamp->getA();
      int c                = bondStamp->getB();

      AtomStamp* atomB = getAtomStamp(b);
      AtomStamp* atomC = getAtomStamp(c);

      AtomStamp::AtomIter ai2;
      AtomStamp::AtomIter ai3;

      for (int a = atomB->getFirstBondedAtom(ai2); a != -1;
           a     = atomB->getNextBondedAtom(ai2)) {
        if (a == c) continue;

        for (int d = atomC->getFirstBondedAtom(ai3); d != -1;
             d     = atomC->getNextBondedAtom(ai3)) {
          if (d == b) continue;

          std::tuple<int, int, int, int> newTorsion {a, b, c, d};
          auto [first, second, third, fourth] = newTorsion;

          // make sure the first element is always less than or equal
          // to the fourth element in IntTuple4
          if (first > fourth) {
            std::swap(first, fourth);
            std::swap(second, third);
          }

          if (allTorsions.find(newTorsion) == allTorsions.end()) {
            allTorsions.insert(newTorsion);
            TorsionStamp* newTorsionStamp = new TorsionStamp();
            newTorsionStamp->setMembers(newTorsion);
            addTorsionStamp(newTorsionStamp);
          }
        }
      }
    }
  }